

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUtility.cpp
# Opt level: O2

int __thiscall TestSuit::run(TestSuit *this)

{
  pointer pTVar1;
  ostream *poVar2;
  pointer pTVar3;
  
  (*this->_vptr_TestSuit[2])();
  poVar2 = std::operator<<((ostream *)&std::cout,"Number of test cases: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  pTVar1 = (this->tests).super__Vector_base<TestFunction,_std::allocator<TestFunction>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pTVar3 = (this->tests).super__Vector_base<TestFunction,_std::allocator<TestFunction>_>.
                _M_impl.super__Vector_impl_data._M_start; pTVar3 != pTVar1; pTVar3 = pTVar3 + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Testing ");
    poVar2 = std::operator<<(poVar2,(string *)pTVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::function<void_()>::operator()(&pTVar3->func);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"All tests passed.");
  std::endl<char,std::char_traits<char>>(poVar2);
  return 0;
}

Assistant:

int TestSuit::run()
{
    setup();
    std::cout << "Number of test cases: " << tests.size() << std::endl;

    for (auto& test : tests)
    {
        std::cout << "Testing " << test.name << std::endl;

        try
        {
            test.func();
        }
        catch (std::exception& e)
        {
            on_failed();
            std::cerr << "test failed." << std::endl;
            std::cerr << e.what() << std::endl;
            return -1;
        }
    }

    std::cout << "All tests passed." << std::endl;
    return 0;
}